

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O2

int pcp_add_server(pcp_ctx_t *ctx,sockaddr *pcp_server,uint8_t pcp_version)

{
  int iVar1;
  pcp_errno pVar2;
  
  if (ctx == (pcp_ctx_t *)0x0) {
    iVar1 = -8;
  }
  else {
    if (pcp_version < 3) {
      pVar2 = psd_add_pcp_server(ctx,pcp_server,pcp_version);
      return pVar2;
    }
    iVar1 = -6;
  }
  return iVar1;
}

Assistant:

int pcp_add_server(pcp_ctx_t *ctx, struct sockaddr *pcp_server,
                   uint8_t pcp_version) {
    int res;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!ctx) {
        return PCP_ERR_BAD_ARGS;
    }
    if (pcp_version > PCP_MAX_SUPPORTED_VERSION) {
        PCP_LOG_END(PCP_LOGLVL_INFO);
        return PCP_ERR_UNSUP_VERSION;
    }

    res = psd_add_pcp_server(ctx, pcp_server, pcp_version);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return res;
}